

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void ecs_run_monitor(ecs_world_t *world,ecs_matched_query_t *monitor,ecs_entities_t *components,
                    int32_t row,int32_t count,ecs_entity_t *entities)

{
  ecs_query_t *query;
  ecs_entity_t entity;
  long *plVar1;
  ecs_iter_t it;
  ecs_iter_t local_110;
  
  query = monitor->query;
  _ecs_assert(query != (ecs_query_t *)0x0,0xc,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x201);
  if (query == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x201,
                  "void ecs_run_monitor(ecs_world_t *, ecs_matched_query_t *, ecs_entities_t *, int32_t, int32_t, ecs_entity_t *)"
                 );
  }
  entity = query->system;
  plVar1 = (long *)ecs_get_w_entity(world,entity,5);
  _ecs_assert(plVar1 != (long *)0x0,0xc,(char *)0x0,"system_data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x205);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 != 0) {
      memset(&local_110,0,0xe0);
      ecs_query_set_iter(world,query,&local_110,monitor->matched_table_index,row,count);
      local_110.param = (void *)plVar1[1];
      if (entities != (ecs_entity_t *)0x0) {
        local_110.entities = entities;
      }
      local_110.world = world;
      local_110.system = entity;
      local_110.triggered_by = components;
      (*(code *)*plVar1)();
    }
    return;
  }
  __assert_fail("system_data != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0x205,
                "void ecs_run_monitor(ecs_world_t *, ecs_matched_query_t *, ecs_entities_t *, int32_t, int32_t, ecs_entity_t *)"
               );
}

Assistant:

void ecs_run_monitor(
    ecs_world_t *world,
    ecs_matched_query_t *monitor,
    ecs_entities_t *components,
    int32_t row,
    int32_t count,
    ecs_entity_t *entities)
{
    ecs_query_t *query = monitor->query;
    ecs_assert(query != NULL, ECS_INTERNAL_ERROR, NULL);

    ecs_entity_t system = query->system;
    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    ecs_assert(system_data != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!system_data->action) {
        return;
    }

    ecs_iter_t it = {0};
    ecs_query_set_iter( world, query, &it, 
        monitor->matched_table_index, row, count);

    it.world = world;
    it.triggered_by = components;
    it.param = system_data->ctx;

    if (entities) {
        it.entities = entities;
    }

    it.system = system;
    system_data->action(&it);
}